

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

void __thiscall QPDFParser::add(QPDFParser *this,shared_ptr<QPDFObject> *obj)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_bool>
  pVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_bool>
  res;
  shared_ptr<QPDFObject> *obj_local;
  QPDFParser *this_local;
  
  if (this->frame->state == st_dictionary_value) {
    pVar1 = std::
            map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>
            ::insert_or_assign<std::shared_ptr<QPDFObject>>
                      ((map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>
                        *)&this->frame->dict,&this->frame->key,obj);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      warnDuplicateKey(this);
    }
    this->frame->state = st_dictionary_key;
  }
  else {
    std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
    emplace_back<std::shared_ptr<QPDFObject>>
              ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)this->frame,obj);
  }
  return;
}

Assistant:

void
QPDFParser::add(std::shared_ptr<QPDFObject>&& obj)
{
    if (frame->state != st_dictionary_value) {
        // If state is st_dictionary_key then there is a missing key. Push onto olist for
        // processing once the tt_dict_close token has been found.
        frame->olist.emplace_back(std::move(obj));
    } else {
        if (auto res = frame->dict.insert_or_assign(frame->key, std::move(obj)); !res.second) {
            warnDuplicateKey();
        }
        frame->state = st_dictionary_key;
    }
}